

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  size_t __size;
  long lVar4;
  timespec start;
  timespec end;
  
  clock_gettime(1,(timespec *)&start);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      free(p);
      p = malloc((long)*(int *)((long)sizes + lVar4));
    }
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, free+malloc:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      p = realloc(p,(long)*(int *)((long)sizes + lVar4));
    }
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, realloc:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  putchar(10);
  clock_gettime(1,(timespec *)&start);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      free(p);
      p = malloc((long)*(int *)((long)sizes + lVar4) << 0xe);
    }
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, free+malloc:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      p = realloc(p,(long)*(int *)((long)sizes + lVar4) << 0xe);
    }
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, realloc:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  putchar(10);
  clock_gettime(1,(timespec *)&start);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      iVar1 = *(int *)((long)sizes + lVar4);
      pvVar2 = realloc(p,(long)iVar1 << 0x14);
      p = realloc(pvVar2,(long)iVar1);
    }
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, realloc*2:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      free(p);
      p = malloc((long)*(int *)((long)sizes + lVar4));
    }
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, free+malloc*2:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  putchar(10);
  clock_gettime(1,(timespec *)&start);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      iVar1 = *(int *)((long)sizes + lVar4);
      pvVar2 = realloc(p,(long)iVar1 << 0x14);
      p = realloc(pvVar2,(long)iVar1 << 10);
    }
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, realloc*2:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      free(p);
      p = malloc((long)*(int *)((long)sizes + lVar4) << 10);
    }
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, free+malloc*2:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  putchar(10);
  clock_gettime(1,(timespec *)&start);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      p = realloc(p,(long)*(int *)((long)sizes + lVar4) << 0x14);
    }
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, realloc:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      free(p);
      p = malloc((long)*(int *)((long)sizes + lVar4) << 0x14);
    }
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, free+malloc:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  putchar(10);
  clock_gettime(1,(timespec *)&start);
  for (lVar4 = 0; lVar4 != 0x20000; lVar4 = lVar4 + 8) {
    pvVar2 = malloc(0x2000);
    *(void **)((long)pages + lVar4) = pvVar2;
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, pages:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  for (lVar4 = 0; lVar4 != 0x20000; lVar4 = lVar4 + 8) {
    free(*(void **)((long)pages + lVar4));
  }
  clock_gettime(1,(timespec *)&start);
  pvVar2 = realloc(p,0x5554000);
  p = pvVar2;
  for (__size = 0x5556000; __size != 0x8002000; __size = __size + 0x2000) {
    pvVar2 = realloc(pvVar2,__size);
  }
  p = pvVar2;
  clock_gettime(1,(timespec *)&end);
  printf("%s, realloc:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  free(p);
  clock_gettime(1,(timespec *)&start);
  pvVar2 = malloc(0x18000000);
  p = realloc(pvVar2,0x8000000);
  clock_gettime(1,(timespec *)&end);
  printf("%s, shrink:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  free(p);
  return 0;
}

Assistant:

int
main()
{
    unsigned int i, j;
    struct timespec start, end;
    long long t;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 16 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 16 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 1024 * 1024);
            p = realloc(p, sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc*2:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024 * 1024);
            if (p)
                free(p);
            p = malloc(sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc*2:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 1024 * 1024);
            p = realloc(p, sizes[j] * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc*2:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024 * 1024);
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc*2:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 1024 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < PAGE_COUNT;i++) {
        pages[i] = malloc(PAGE_SIZE);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, pages:\n\t %lld\n", __func__, t);
    for (i = 0;i < PAGE_COUNT;i++) {
        free(pages[i]);
    }

    clock_gettime(CLOCK_ID, &start);
    p = realloc(p, PAGE_INIT * PAGE_SIZE);
    for (i = PAGE_INIT + 1;i <= PAGE_COUNT;i++) {
        p = realloc(p, PAGE_SIZE * i);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    free(p);

    clock_gettime(CLOCK_ID, &start);
    p = malloc(PAGE_COUNT * PAGE_SIZE * 3);
    p = realloc(p, PAGE_COUNT * PAGE_SIZE);
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, shrink:\n\t %lld\n", __func__, t);

    free(p);
    return 0;
}